

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O1

void obj_timer_checks(obj *otmp,xchar x,xchar y,int force)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  boolean bVar4;
  long lVar5;
  ulong uVar6;
  short func_index;
  
  bVar1 = otmp->where;
  if (((otmp->otyp == 0x10e) && ((bVar1 | 4) == 5)) &&
     (bVar4 = is_ice(otmp->olev,(int)x,(int)y), bVar4 != '\0')) {
    lVar5 = stop_timer(otmp->olev,1,otmp);
    if (lVar5 == 0) {
      lVar5 = stop_timer(otmp->olev,2,otmp);
      func_index = 2;
    }
    else {
      func_index = 1;
    }
    uVar3 = moves;
    if (lVar5 != 0) {
      uVar6 = (ulong)moves;
      *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfff8ffff | 0x10000;
      lVar5 = (lVar5 - uVar6) * 2;
      otmp->age = otmp->age * 2 - uVar3;
LAB_001e11e1:
      bVar2 = false;
      goto LAB_001e11e8;
    }
  }
  else {
    func_index = 1;
    if (((otmp->otyp == 0x10e) && ((otmp->field_0x4c & 7) != 0)) &&
       ((bVar1 != 1 || (bVar4 = is_ice(otmp->olev,(int)x,(int)y), bVar4 == '\0')))) {
      lVar5 = stop_timer(otmp->olev,1,otmp);
      if (lVar5 == 0) {
        lVar5 = stop_timer(otmp->olev,2,otmp);
        func_index = 2;
      }
      else {
        func_index = 1;
      }
      uVar3 = moves;
      if (lVar5 != 0) {
        uVar6 = (ulong)moves;
        *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfff8ffff;
        lVar5 = (long)(lVar5 - uVar6) / 2;
        otmp->age = (uVar3 - otmp->age >> 1) + otmp->age;
        goto LAB_001e11e1;
      }
    }
  }
  bVar2 = true;
  lVar5 = 0;
LAB_001e11e8:
  if (!bVar2) {
    start_timer(otmp->olev,lVar5,2,func_index,otmp);
    return;
  }
  return;
}

Assistant:

static void obj_timer_checks(struct obj *otmp, xchar x, xchar y,
			     int force)	/* 0 = no force so do checks, <0 = force off, >0 force on */
{
    long tleft = 0L;
    short action = ROT_CORPSE;
    boolean restart_timer = FALSE;
    boolean on_floor = (otmp->where == OBJ_FLOOR);
    boolean buried = (otmp->where == OBJ_BURIED);

    /* Check for corpses just placed on or in ice */
    if (otmp->otyp == CORPSE && (on_floor || buried) && is_ice(otmp->olev,x,y)) {
	tleft = stop_timer(otmp->olev, action, otmp);
	if (tleft == 0L) {
		action = REVIVE_MON;
		tleft = stop_timer(otmp->olev, action, otmp);
	} 
	if (tleft != 0L) {
	    long age;
	    
	    tleft = tleft - moves;
	    /* mark the corpse as being on ice */
	    ON_ICE(otmp) = 1;

	    /* Adjust the time remaining */
	    tleft *= ROT_ICE_ADJUSTMENT;
	    restart_timer = TRUE;
	    /* Adjust the age; must be same as in obj_ice_age() */
	    age = moves - otmp->age;
	    otmp->age = moves - (age * ROT_ICE_ADJUSTMENT);
	}
    }
    /* Check for corpses coming off ice */
    else if ((force < 0) ||
	     (otmp->otyp == CORPSE && ON_ICE(otmp) &&
	     ((on_floor && !is_ice(otmp->olev, x, y)) || !on_floor))) {
	tleft = stop_timer(otmp->olev, action, otmp);
	if (tleft == 0L) {
		action = REVIVE_MON;
		tleft = stop_timer(otmp->olev, action, otmp);
	}
	if (tleft != 0L) {
		long age;

		tleft = tleft - moves;
		ON_ICE(otmp) = 0;

		/* Adjust the remaining time */
		tleft /= ROT_ICE_ADJUSTMENT;
		restart_timer = TRUE;
		/* Adjust the age */
		age = moves - otmp->age;
		otmp->age = otmp->age + (age / ROT_ICE_ADJUSTMENT);
	}
    }
    /* now re-start the timer with the appropriate modifications */ 
    if (restart_timer)
	start_timer(otmp->olev, tleft, TIMER_OBJECT, action, otmp);
}